

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::UnidimLipmDcmEstimator::UnidimLipmDcmEstimator
          (UnidimLipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,double initDcm,
          double initZMP,double initBias,double dcmMeasureErrorStd,double zmpMeasureErrorStd,
          double initDcmUncertainty,double initBiasUncertainty)

{
  LinearKalmanFilter *this_00;
  Vector2 *pVVar1;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar2;
  Matrix1 *other;
  Matrix2 P;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_a0;
  double local_80;
  double local_78;
  double initBias_local;
  Vector2 x;
  double local_58;
  Scalar local_50;
  Scalar local_48;
  CommaInitializer<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> local_40;
  
  this->omega0_ = omega_0;
  this->dt_ = dt;
  this->biasDriftStd_ = biasDriftStd;
  this->zmpErrorStd_ = zmpMeasureErrorStd;
  this->previousZmp_ = initZMP;
  this_00 = &this->filter_;
  local_80 = initDcm;
  local_78 = dcmMeasureErrorStd;
  initBias_local = initBias;
  LinearKalmanFilter::LinearKalmanFilter(this_00,2,1,1);
  updateMatricesABQ_(this);
  pVVar1 = &this->C_;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] = 0.0;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[0] =
       1.0;
  local_a0.m_xpr = (Matrix<double,_2,_2,_0,_2,_2> *)0x3ff0000000000000;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (double)pVVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&P,(Scalar *)&local_a0);
  other = &this->R_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&P);
  local_40.m_row = 0;
  local_40.m_col = 1;
  local_40.m_currentBlockRows = 1;
  (other->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array[0] =
       local_78 * local_78;
  local_40.m_xpr = other;
  Eigen::CommaInitializer<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::finished(&local_40);
  local_a0.m_xpr = (Matrix<double,_2,_2,_0,_2,_2> *)pVVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&P,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_> *)&local_a0);
  KalmanFilterBase::setC(&this_00->super_KalmanFilterBase,(Cmatrix *)&P);
  free((void *)P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
               [0]);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&P,
             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)other);
  (*(this_00->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
    [0x2e])(this_00,&P);
  free((void *)P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
               [0]);
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (double)&x;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] = 0.0;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  x.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       local_80;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&P,&initBias_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&P);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&P,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&x);
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&P,0);
  free((void *)P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
               [0]);
  local_a0.m_row = 0;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       initDcmUncertainty * initDcmUncertainty;
  local_a0.m_col = 1;
  local_a0.m_currentBlockRows = 1;
  local_48 = 0.0;
  local_a0.m_xpr = &P;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (&local_a0,&local_48);
  local_50 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar2,&local_50);
  local_58 = initBiasUncertainty * initBiasUncertainty;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar2,&local_58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished(&local_a0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,2,0,2,2>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a0,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&P);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_a0);
  free(local_a0.m_xpr);
  return;
}

Assistant:

UnidimLipmDcmEstimator::UnidimLipmDcmEstimator(double dt,
                                               double omega_0,
                                               double biasDriftStd,
                                               double initDcm,
                                               double initZMP,
                                               double initBias,
                                               double dcmMeasureErrorStd,
                                               double zmpMeasureErrorStd,
                                               double initDcmUncertainty,
                                               double initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  filter_(2, 1, 1)
{
  updateMatricesABQ_();
  C_ << 1., 1.;
  R_ << square(dcmMeasureErrorStd);
  filter_.setC(C_.transpose());
  filter_.setMeasurementCovariance(R_);
  Vector2 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix2 P;
  // clang-format off
  P<< square(initDcmUncertainty),  0,
      0,                           square(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}